

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAbbreviationDeclaration.cpp
# Opt level: O0

size_t __thiscall
llvm::DWARFAbbreviationDeclaration::FixedSizeInfo::getByteSize(FixedSizeInfo *this,DWARFUnit *U)

{
  byte bVar1;
  byte bVar2;
  size_t local_20;
  size_t ByteSize;
  DWARFUnit *U_local;
  FixedSizeInfo *this_local;
  
  local_20 = (size_t)this->NumBytes;
  if (this->NumAddrs != '\0') {
    bVar1 = this->NumAddrs;
    bVar2 = DWARFUnit::getAddressByteSize(U);
    local_20 = (long)(int)((uint)bVar1 * (uint)bVar2) + local_20;
  }
  if (this->NumRefAddrs != '\0') {
    bVar1 = this->NumRefAddrs;
    bVar2 = DWARFUnit::getRefAddrByteSize(U);
    local_20 = (long)(int)((uint)bVar1 * (uint)bVar2) + local_20;
  }
  if (this->NumDwarfOffsets != '\0') {
    bVar1 = this->NumDwarfOffsets;
    bVar2 = DWARFUnit::getDwarfOffsetByteSize(U);
    local_20 = (long)(int)((uint)bVar1 * (uint)bVar2) + local_20;
  }
  return local_20;
}

Assistant:

size_t DWARFAbbreviationDeclaration::FixedSizeInfo::getByteSize(
    const DWARFUnit &U) const {
  size_t ByteSize = NumBytes;
  if (NumAddrs)
    ByteSize += NumAddrs * U.getAddressByteSize();
  if (NumRefAddrs)
    ByteSize += NumRefAddrs * U.getRefAddrByteSize();
  if (NumDwarfOffsets)
    ByteSize += NumDwarfOffsets * U.getDwarfOffsetByteSize();
  return ByteSize;
}